

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3Atoi64(char *zNum,i64 *pNum,int length,u8 enc)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  undefined7 in_register_00000009;
  byte *pbVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  byte *pbVar9;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  int i;
  ulong uVar13;
  byte *pbVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  
  uVar4 = (uint)CONCAT71(in_register_00000009,enc);
  if (uVar4 == 1) {
    uVar11 = 1;
    bVar3 = false;
    pbVar5 = (byte *)zNum;
  }
  else {
    uVar11 = 2;
    for (lVar17 = (long)(int)(3 - uVar4);
        (bVar3 = lVar17 < (int)(length & 0xfffffffe), lVar17 < (int)(length & 0xfffffffe) &&
        (zNum[lVar17] == '\0')); lVar17 = lVar17 + 2) {
    }
    length = (uint)lVar17 ^ 1;
    pbVar5 = (byte *)(zNum + (uVar4 & 1));
  }
  pbVar9 = (byte *)(zNum + length);
  uVar12 = (ulong)uVar11;
  for (; bVar2 = true, pbVar5 < pbVar9; pbVar5 = pbVar5 + uVar12) {
    bVar1 = *pbVar5;
    if ((""[bVar1] & 1) == 0) {
      if (bVar1 == 0x2b) {
        pbVar5 = pbVar5 + uVar12;
      }
      else if (bVar1 == 0x2d) {
        pbVar5 = pbVar5 + uVar12;
        bVar2 = false;
      }
      break;
    }
  }
  lVar17 = 0;
  for (; (pbVar5 < pbVar9 && (*pbVar5 == 0x30)); pbVar5 = pbVar5 + uVar12) {
    lVar17 = lVar17 + uVar12;
  }
  lVar15 = 0;
  for (lVar16 = 0; (pbVar14 = pbVar5 + lVar16, pbVar14 < pbVar9 && ((byte)(*pbVar14 - 0x30) < 10));
      lVar16 = lVar16 + uVar12) {
    lVar15 = lVar15 * 10 + (ulong)*pbVar14 + -0x30;
  }
  lVar10 = -0x8000000000000000;
  lVar7 = -lVar15;
  lVar6 = lVar10;
  if (bVar2) {
    lVar6 = 0x7fffffffffffffff;
    lVar7 = lVar15;
  }
  if (lVar15 < 0) {
    lVar7 = lVar6;
  }
  *pNum = lVar7;
  if (lVar17 == 0 && lVar16 == 0) {
    uVar4 = 0xffffffff;
  }
  else if (pbVar14 < pbVar9 && bVar3 == false) {
    uVar4 = 1;
    do {
      if ((""[*pbVar14] & 1) == 0) goto LAB_00132631;
      pbVar14 = pbVar14 + uVar12;
    } while (pbVar14 < pbVar9);
    uVar4 = 0;
  }
  else {
    uVar4 = (uint)bVar3;
  }
LAB_00132631:
  if (uVar11 * 0x13 <= (uint)lVar16) {
    if (uVar11 * 0x13 < (uint)lVar16) {
      iVar8 = 1;
    }
    else {
      iVar8 = 0;
      pbVar9 = pbVar5;
      for (uVar13 = 0; (iVar8 == 0 && (uVar13 < 0x12)); uVar13 = uVar13 + 1) {
        iVar8 = ((int)(char)*pbVar9 - (int)"922337203685477580"[uVar13]) * 10;
        pbVar9 = pbVar9 + uVar12;
      }
      if (iVar8 == 0) {
        iVar8 = (char)pbVar5[uVar12 * 0x12] + -0x38;
      }
      if (iVar8 < 0) {
        return uVar4;
      }
    }
    if (bVar2) {
      lVar10 = 0x7fffffffffffffff;
    }
    *pNum = lVar10;
    if (bVar2) {
      uVar4 = 3;
    }
    if (iVar8 != 0) {
      uVar4 = 2;
    }
  }
  return uVar4;
}

Assistant:

SQLITE_PRIVATE int sqlite3Atoi64(const char *zNum, i64 *pNum, int length, u8 enc){
  int incr;
  u64 u = 0;
  int neg = 0; /* assume positive */
  int i;
  int c = 0;
  int nonNum = 0;  /* True if input contains UTF16 with high byte non-zero */
  int rc;          /* Baseline return code */
  const char *zStart;
  const char *zEnd = zNum + length;
  assert( enc==SQLITE_UTF8 || enc==SQLITE_UTF16LE || enc==SQLITE_UTF16BE );
  if( enc==SQLITE_UTF8 ){
    incr = 1;
  }else{
    incr = 2;
    length &= ~1;
    assert( SQLITE_UTF16LE==2 && SQLITE_UTF16BE==3 );
    for(i=3-enc; i<length && zNum[i]==0; i+=2){}
    nonNum = i<length;
    zEnd = &zNum[i^1];
    zNum += (enc&1);
  }
  while( zNum<zEnd && sqlite3Isspace(*zNum) ) zNum+=incr;
  if( zNum<zEnd ){
    if( *zNum=='-' ){
      neg = 1;
      zNum+=incr;
    }else if( *zNum=='+' ){
      zNum+=incr;
    }
  }
  zStart = zNum;
  while( zNum<zEnd && zNum[0]=='0' ){ zNum+=incr; } /* Skip leading zeros. */
  for(i=0; &zNum[i]<zEnd && (c=zNum[i])>='0' && c<='9'; i+=incr){
    u = u*10 + c - '0';
  }
  testcase( i==18*incr );
  testcase( i==19*incr );
  testcase( i==20*incr );
  if( u>LARGEST_INT64 ){
    /* This test and assignment is needed only to suppress UB warnings
    ** from clang and -fsanitize=undefined.  This test and assignment make
    ** the code a little larger and slower, and no harm comes from omitting
    ** them, but we must appaise the undefined-behavior pharisees. */
    *pNum = neg ? SMALLEST_INT64 : LARGEST_INT64;
  }else if( neg ){
    *pNum = -(i64)u;
  }else{
    *pNum = (i64)u;
  }
  rc = 0;
  if( i==0 && zStart==zNum ){    /* No digits */
    rc = -1;
  }else if( nonNum ){            /* UTF16 with high-order bytes non-zero */
    rc = 1;
  }else if( &zNum[i]<zEnd ){     /* Extra bytes at the end */
    int jj = i;
    do{
      if( !sqlite3Isspace(zNum[jj]) ){
        rc = 1;          /* Extra non-space text after the integer */
        break;
      }
      jj += incr;
    }while( &zNum[jj]<zEnd );
  }
  if( i<19*incr ){
    /* Less than 19 digits, so we know that it fits in 64 bits */
    assert( u<=LARGEST_INT64 );
    return rc;
  }else{
    /* zNum is a 19-digit numbers.  Compare it against 9223372036854775808. */
    c = i>19*incr ? 1 : compare2pow63(zNum, incr);
    if( c<0 ){
      /* zNum is less than 9223372036854775808 so it fits */
      assert( u<=LARGEST_INT64 );
      return rc;
    }else{
      *pNum = neg ? SMALLEST_INT64 : LARGEST_INT64;
      if( c>0 ){
        /* zNum is greater than 9223372036854775808 so it overflows */
        return 2;
      }else{
        /* zNum is exactly 9223372036854775808.  Fits if negative.  The
        ** special case 2 overflow if positive */
        assert( u-1==LARGEST_INT64 );
        return neg ? rc : 3;
      }
    }
  }
}